

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter::SigmaPointPrediction
          (UnscentedKalmanFilter *this,double delta_t,MatrixXd *Xsig_aug,MatrixXd *Xsig_pred)

{
  double dVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a8;
  double local_88;
  
  if (0 < this->n_sigma_) {
    lVar8 = 0;
    do {
      lVar6 = (Xsig_aug->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      if (((((lVar6 < 1) ||
            ((Xsig_aug->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols <= lVar8)) || (lVar6 < 2)) || ((lVar6 == 2 || (lVar6 < 4)))) ||
         ((lVar6 == 4 || ((lVar6 < 6 || (lVar6 == 6)))))) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x72,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                     );
      }
      pdVar5 = (Xsig_aug->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar6 = lVar6 * lVar8;
      dVar12 = pdVar5[lVar6];
      dVar13 = pdVar5[lVar6 + 1];
      dVar1 = pdVar5[lVar6 + 2];
      __x = pdVar5[lVar6 + 3];
      dVar2 = pdVar5[lVar6 + 4];
      dVar3 = pdVar5[lVar6 + 5];
      dVar4 = pdVar5[lVar6 + 6];
      if (ABS(dVar2) <= 0.001) {
        local_88 = cos(__x);
        local_88 = local_88 * dVar1 * delta_t;
        local_a8 = sin(__x);
        local_a8 = local_a8 * dVar1 * delta_t;
      }
      else {
        dVar9 = dVar2 * delta_t + __x;
        dVar10 = sin(dVar9);
        dVar11 = sin(__x);
        local_88 = (dVar10 - dVar11) * (dVar1 / dVar2);
        dVar10 = cos(__x);
        dVar9 = cos(dVar9);
        local_a8 = (dVar10 - dVar9) * (dVar1 / dVar2);
      }
      local_88 = local_88 + dVar12;
      local_a8 = local_a8 + dVar13;
      dVar12 = cos(__x);
      dVar13 = sin(__x);
      lVar6 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      if ((lVar6 < 1) ||
         ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols <= lVar8)) {
LAB_0011c97b:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      dVar9 = dVar3 * 0.5 * delta_t * delta_t;
      pdVar5 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar7 = lVar6 * lVar8;
      pdVar5[lVar7] = dVar12 * dVar9 + local_88;
      if ((lVar6 < 2) || (pdVar5[lVar7 + 1] = dVar9 * dVar13 + local_a8, lVar6 == 2))
      goto LAB_0011c97b;
      pdVar5[lVar7 + 2] = dVar3 * delta_t + dVar1;
      if ((lVar6 < 4) ||
         (pdVar5[lVar7 + 3] = dVar4 * 0.5 * delta_t * delta_t + dVar2 * delta_t + __x, lVar6 == 4))
      goto LAB_0011c97b;
      pdVar5[lVar7 + 4] = dVar4 * delta_t + dVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->n_sigma_);
  }
  return;
}

Assistant:

void UnscentedKalmanFilter::SigmaPointPrediction(double delta_t, const MatrixXd &Xsig_aug, MatrixXd &Xsig_pred) const {

  for (int i=0; i<n_sigma_; i++) {

    // extract values for better readability
    double px      = Xsig_aug(0,i);
    double py      = Xsig_aug(1,i);
    double v       = Xsig_aug(2,i);
    double yaw     = Xsig_aug(3,i);
    double yawd    = Xsig_aug(4,i);
    double nua     = Xsig_aug(5,i);
    double nuyawdd = Xsig_aug(6,i);

    // predicted state values
    double px_p, py_p;

    if (fabs(yawd) > 0.001) {
      px_p = px + v/yawd * (sin(yaw+yawd*delta_t) - sin(yaw));
      py_p = py + v/yawd * (cos(yaw) - cos(yaw+yawd*delta_t));
    } else {
      px_p = px + v*delta_t*cos(yaw);
      py_p = py + v*delta_t*sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd*delta_t;
    double yawd_p = yawd;

    // add noise
    double dts = delta_t * delta_t;
    px_p = px_p + 0.5*nua*dts*cos(yaw);
    py_p = py_p + 0.5*nua*dts*sin(yaw);
    v_p = v_p + nua*delta_t;

    yaw_p = yaw_p + 0.5*nuyawdd*dts;
    yawd_p = yawd_p + nuyawdd*delta_t;

    // write predicted sigma point into right column
    Xsig_pred(0,i) = px_p;
    Xsig_pred(1,i) = py_p;
    Xsig_pred(2,i) = v_p; 
    Xsig_pred(3,i) = yaw_p;
    Xsig_pred(4,i) = yawd_p;
  }
}